

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::CollapsingHeader(char *label,bool *p_open,ImGuiTreeNodeFlags flags)

{
  bool bVar1;
  ImGuiID IVar2;
  uint uVar3;
  ImGuiWindow *this;
  ImVec2 local_7c;
  float local_74;
  float local_70;
  float button_y;
  float button_x;
  float button_size;
  ImGuiItemHoveredDataBackup last_item_backup;
  ImGuiContext *g;
  bool is_open;
  ImGuiID id;
  ImGuiWindow *window;
  ImGuiTreeNodeFlags flags_local;
  bool *p_open_local;
  char *label_local;
  
  this = GetCurrentWindow();
  if ((this->SkipItems & 1U) == 0) {
    if ((p_open == (bool *)0x0) || ((*p_open & 1U) != 0)) {
      IVar2 = ImGuiWindow::GetID(this,label,(char *)0x0);
      uVar3 = 0;
      if (p_open != (bool *)0x0) {
        uVar3 = 0x100004;
      }
      label_local._7_1_ = TreeNodeBehavior(IVar2,uVar3 | 0x1a | flags,label,(char *)0x0);
      if (p_open != (bool *)0x0) {
        last_item_backup.LastItemDisplayRect.Max = (ImVec2)GImGui;
        ImGuiItemHoveredDataBackup::ImGuiItemHoveredDataBackup
                  ((ImGuiItemHoveredDataBackup *)&button_x);
        button_y = *(float *)((long)last_item_backup.LastItemDisplayRect.Max + 0x1920);
        local_70 = ImMax<float>((this->DC).LastItemRect.Min.x,
                                (-*(float *)((long)last_item_backup.LastItemDisplayRect.Max + 0x15a0
                                            ) +
                                 -*(float *)((long)last_item_backup.LastItemDisplayRect.Max + 0x15a0
                                            ) + (this->DC).LastItemRect.Max.x) - button_y);
        local_74 = (this->DC).LastItemRect.Min.y;
        IVar2 = ImGuiWindow::GetID(this,(void *)((ulong)IVar2 + 1));
        ImVec2::ImVec2(&local_7c,local_70,local_74);
        bVar1 = CloseButton(IVar2,&local_7c);
        if (bVar1) {
          *p_open = false;
        }
        ImGuiItemHoveredDataBackup::Restore((ImGuiItemHoveredDataBackup *)&button_x);
      }
    }
    else {
      label_local._7_1_ = false;
    }
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::CollapsingHeader(const char* label, bool* p_open, ImGuiTreeNodeFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    if (p_open && !*p_open)
        return false;

    ImGuiID id = window->GetID(label);
    flags |= ImGuiTreeNodeFlags_CollapsingHeader | (p_open ? ImGuiTreeNodeFlags_AllowItemOverlap | ImGuiTreeNodeFlags_ClipLabelForTrailingButton : 0);
    bool is_open = TreeNodeBehavior(id, flags, label);
    if (p_open)
    {
        // Create a small overlapping close button
        // FIXME: We can evolve this into user accessible helpers to add extra buttons on title bars, headers, etc.
        // FIXME: CloseButton can overlap into text, need find a way to clip the text somehow.
        ImGuiContext& g = *GImGui;
        ImGuiItemHoveredDataBackup last_item_backup;
        float button_size = g.FontSize;
        float button_x = ImMax(window->DC.LastItemRect.Min.x, window->DC.LastItemRect.Max.x - g.Style.FramePadding.x * 2.0f - button_size);
        float button_y = window->DC.LastItemRect.Min.y;
        if (CloseButton(window->GetID((void*)((intptr_t)id + 1)), ImVec2(button_x, button_y)))
            *p_open = false;
        last_item_backup.Restore();
    }

    return is_open;
}